

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     outs<unsigned_short,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,uint16_t port,
               unsigned_short *eSI,Context *context)

{
  type_conflict2 value;
  
  if (*eCX != 0) {
    value = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)0>
                      (&context->memory,(Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES
                       ,*eSI);
    PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::out<unsigned_short>
              (&context->io,port,value);
    *eSI = *eSI + (short)(context->flags).direction_ * 2;
    *eCX = *eCX - 1;
    if (*eCX != 0) {
      (context->flow_controller).should_repeat_ = true;
    }
  }
  return;
}

Assistant:

bool repetition_over(
	const AddressT &eCX
) {
	return repetition != Repetition::None && !eCX;
}